

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O0

int CVodeSensInit(void *cvode_mem,int Ns,int ism,CVSensRhsFn fS,N_Vector *yS0)

{
  int iVar1;
  uint uVar2;
  sunrealtype *psVar3;
  N_Vector *pp_Var4;
  CVSensRhsFn in_RCX;
  int in_EDX;
  int in_ESI;
  CVodeMem in_RDI;
  N_Vector in_R8;
  SUNNonlinearSolver NLS;
  int retval;
  int is;
  int allocOK;
  CVodeMem cv_mem;
  SUNNonlinearSolver local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffffcc;
  int count;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-0x15,0x581,"CVodeSensInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"cvode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->cv_SensMallocDone == 0) {
    if (in_ESI < 1) {
      cvProcessError(in_RDI,-0x16,0x593,"CVodeSensInit",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                     ,"NS <= 0 illegal.");
      local_4 = -0x16;
    }
    else {
      in_RDI->cv_Ns = in_ESI;
      if (in_EDX == 3) {
        cvProcessError(in_RDI,-0x16,0x59d,"CVodeSensInit",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                       ,"Illegal ism = CV_STAGGERED1 for CVodeSensInit.");
        local_4 = -0x16;
      }
      else if ((in_EDX == 1) || (in_EDX == 2)) {
        in_RDI->cv_ism = in_EDX;
        if (in_R8 == (N_Vector)0x0) {
          cvProcessError(in_RDI,-0x16,0x5b0,"CVodeSensInit",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                         ,"yS0 = NULL illegal.");
          local_4 = -0x16;
        }
        else {
          in_RDI->cv_ifS = 2;
          in_RDI->cv_fS1 = (CVSensRhs1Fn)0x0;
          if (in_RCX == (CVSensRhsFn)0x0) {
            in_RDI->cv_fSDQ = 1;
            in_RDI->cv_fS = cvSensRhsInternalDQ;
            in_RDI->cv_fS_data = in_RDI;
          }
          else {
            in_RDI->cv_fSDQ = 0;
            in_RDI->cv_fS = in_RCX;
            in_RDI->cv_fS_data = in_RDI->cv_user_data;
          }
          in_RDI->cv_stgr1alloc = 0;
          iVar1 = cvSensAllocVectors((CVodeMem)
                                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                     (N_Vector)
                                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
          count = (int)((ulong)in_RCX >> 0x20);
          if (iVar1 == 0) {
            cvProcessError(in_RDI,-0x14,0x5d0,"CVodeSensInit",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                           ,"A memory request failed.");
            local_4 = -0x14;
          }
          else {
            if (0xd < in_ESI * 0xd) {
              free(in_RDI->cv_cvals);
              in_RDI->cv_cvals = (sunrealtype *)0x0;
              free(in_RDI->cv_Xvecs);
              in_RDI->cv_Xvecs = (N_Vector *)0x0;
              free(in_RDI->cv_Zvecs);
              in_RDI->cv_Zvecs = (N_Vector *)0x0;
              psVar3 = (sunrealtype *)malloc((long)(in_ESI * 0xd) << 3);
              in_RDI->cv_cvals = psVar3;
              pp_Var4 = (N_Vector *)malloc((long)(in_ESI * 0xd) << 3);
              in_RDI->cv_Xvecs = pp_Var4;
              pp_Var4 = (N_Vector *)malloc((long)(in_ESI * 0xd) << 3);
              in_RDI->cv_Zvecs = pp_Var4;
              if (((in_RDI->cv_cvals == (sunrealtype *)0x0) || (in_RDI->cv_Xvecs == (N_Vector *)0x0)
                  ) || (in_RDI->cv_Zvecs == (N_Vector *)0x0)) {
                cvSensFreeVectors((CVodeMem)
                                  CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
                cvProcessError(in_RDI,-0x14,0x5e7,"CVodeSensInit",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                               ,"A memory request failed.");
                return -0x14;
              }
            }
            for (iVar5 = 0; iVar5 < in_ESI; iVar5 = iVar5 + 1) {
              in_RDI->cv_cvals[iVar5] = 1.0;
            }
            iVar5 = N_VScaleVectorArray(in_ESI,in_RDI->cv_cvals,in_R8,in_RDI->cv_znS[0]);
            if (iVar5 == 0) {
              in_RDI->cv_nfSe = 0;
              in_RDI->cv_nfeS = 0;
              in_RDI->cv_ncfnS = 0;
              in_RDI->cv_netfS = 0;
              in_RDI->cv_nniS = 0;
              in_RDI->cv_nnfS = 0;
              in_RDI->cv_nsetupsS = 0;
              for (iVar6 = 0; iVar6 < in_ESI; iVar6 = iVar6 + 1) {
                in_RDI->cv_plist[iVar6] = iVar6;
                in_RDI->cv_pbar[iVar6] = 1.0;
              }
              in_RDI->cv_sensi = 1;
              in_RDI->cv_SensMallocDone = 1;
              if (in_EDX == 1) {
                local_48 = SUNNonlinSol_NewtonSens(count,in_R8,(SUNContext)in_RDI);
              }
              else {
                local_48 = SUNNonlinSol_NewtonSens(count,in_R8,(SUNContext)in_RDI);
              }
              if (local_48 == (SUNNonlinearSolver)0x0) {
                cvProcessError(in_RDI,-0x14,0x61c,"CVodeSensInit",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                               ,"A memory request failed.");
                cvSensFreeVectors((CVodeMem)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
                local_4 = -0x14;
              }
              else {
                if (in_EDX == 1) {
                  uVar2 = CVodeSetNonlinearSolverSensSim
                                    ((void *)CONCAT44(iVar1,iVar6),
                                     (SUNNonlinearSolver)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
                }
                else {
                  uVar2 = CVodeSetNonlinearSolverSensStg
                                    ((void *)CONCAT44(iVar1,iVar6),
                                     (SUNNonlinearSolver)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
                }
                if (uVar2 == 0) {
                  if (in_EDX == 1) {
                    in_RDI->ownNLSsim = 1;
                  }
                  else {
                    in_RDI->ownNLSstg = 1;
                  }
                  local_4 = 0;
                }
                else {
                  cvProcessError(in_RDI,(int)(ulong)uVar2,0x62c,"CVodeSensInit",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                                 ,"Setting the nonlinear solver failed");
                  cvSensFreeVectors((CVodeMem)CONCAT44(uVar2,in_stack_ffffffffffffffc0));
                  SUNNonlinSolFree(local_48);
                  local_4 = -0x14;
                }
              }
            }
            else {
              local_4 = -0x1c;
            }
          }
        }
      }
      else {
        cvProcessError(in_RDI,-0x16,0x5a6,"CVodeSensInit",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                       ,
                       "Illegal value for ism. Legal values are: CV_SIMULTANEOUS, CV_STAGGERED and CV_STAGGERED1."
                      );
        local_4 = -0x16;
      }
    }
  }
  else {
    cvProcessError(in_RDI,-0x16,0x58a,"CVodeSensInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvodes/cvodes.c"
                   ,"Sensitivity analysis already initialized.");
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int CVodeSensInit(void* cvode_mem, int Ns, int ism, CVSensRhsFn fS, N_Vector* yS0)
{
  CVodeMem cv_mem;
  sunbooleantype allocOK;
  int is, retval;
  SUNNonlinearSolver NLS;

  /* Check cvode_mem */

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CV_MEM_NULL, __LINE__, __func__, __FILE__, MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Check if CVodeSensInit or CVodeSensInit1 was already called */

  if (cv_mem->cv_SensMallocDone)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_SENSINIT_2);
    return (CV_ILL_INPUT);
  }

  /* Check if Ns is legal */

  if (Ns <= 0)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_NS);
    return (CV_ILL_INPUT);
  }
  cv_mem->cv_Ns = Ns;

  /* Check if ism is compatible */

  if (ism == CV_STAGGERED1)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ISM_IFS);
    return (CV_ILL_INPUT);
  }

  /* Check if ism is legal */

  if ((ism != CV_SIMULTANEOUS) && (ism != CV_STAGGERED))
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_BAD_ISM);
    return (CV_ILL_INPUT);
  }
  cv_mem->cv_ism = ism;

  /* Check if yS0 is non-null */

  if (yS0 == NULL)
  {
    cvProcessError(cv_mem, CV_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGCV_NULL_YS0);
    return (CV_ILL_INPUT);
  }

  /* Store sensitivity RHS-related data */

  cv_mem->cv_ifS = CV_ALLSENS;
  cv_mem->cv_fS1 = NULL;

  if (fS == NULL)
  {
    cv_mem->cv_fSDQ    = SUNTRUE;
    cv_mem->cv_fS      = cvSensRhsInternalDQ;
    cv_mem->cv_fS_data = cvode_mem;
  }
  else
  {
    cv_mem->cv_fSDQ    = SUNFALSE;
    cv_mem->cv_fS      = fS;
    cv_mem->cv_fS_data = cv_mem->cv_user_data;
  }

  /* No memory allocation for STAGGERED1 */

  cv_mem->cv_stgr1alloc = SUNFALSE;

  /* Allocate the vectors (using yS0[0] as a template) */

  allocOK = cvSensAllocVectors(cv_mem, yS0[0]);
  if (!allocOK)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    return (CV_MEM_FAIL);
  }

  /* Check if larger temporary work arrays are needed for fused vector ops */
  if (Ns * L_MAX > L_MAX)
  {
    free(cv_mem->cv_cvals);
    cv_mem->cv_cvals = NULL;
    free(cv_mem->cv_Xvecs);
    cv_mem->cv_Xvecs = NULL;
    free(cv_mem->cv_Zvecs);
    cv_mem->cv_Zvecs = NULL;

    cv_mem->cv_cvals = (sunrealtype*)malloc((Ns * L_MAX) * sizeof(sunrealtype));
    cv_mem->cv_Xvecs = (N_Vector*)malloc((Ns * L_MAX) * sizeof(N_Vector));
    cv_mem->cv_Zvecs = (N_Vector*)malloc((Ns * L_MAX) * sizeof(N_Vector));

    if ((cv_mem->cv_cvals == NULL) || (cv_mem->cv_Xvecs == NULL) ||
        (cv_mem->cv_Zvecs == NULL))
    {
      cvSensFreeVectors(cv_mem);
      cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                     MSGCV_MEM_FAIL);
      return (CV_MEM_FAIL);
    }
  }

  /*----------------------------------------------
    All error checking is complete at this point
    -----------------------------------------------*/

  /* Initialize znS[0] in the history array */

  for (is = 0; is < Ns; is++) { cv_mem->cv_cvals[is] = ONE; }

  retval = N_VScaleVectorArray(Ns, cv_mem->cv_cvals, yS0, cv_mem->cv_znS[0]);
  if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

  /* Initialize all sensitivity related counters */

  cv_mem->cv_nfSe     = 0;
  cv_mem->cv_nfeS     = 0;
  cv_mem->cv_ncfnS    = 0;
  cv_mem->cv_netfS    = 0;
  cv_mem->cv_nniS     = 0;
  cv_mem->cv_nnfS     = 0;
  cv_mem->cv_nsetupsS = 0;

  /* Set default values for plist and pbar */

  for (is = 0; is < Ns; is++)
  {
    cv_mem->cv_plist[is] = is;
    cv_mem->cv_pbar[is]  = ONE;
  }

  /* Sensitivities will be computed */

  cv_mem->cv_sensi          = SUNTRUE;
  cv_mem->cv_SensMallocDone = SUNTRUE;

  /* create a Newton nonlinear solver object by default */
  if (ism == CV_SIMULTANEOUS)
  {
    NLS = SUNNonlinSol_NewtonSens(Ns + 1, cv_mem->cv_acor, cv_mem->cv_sunctx);
  }
  else
  {
    NLS = SUNNonlinSol_NewtonSens(Ns, cv_mem->cv_acor, cv_mem->cv_sunctx);
  }

  /* check that the nonlinear solver is non-NULL */
  if (NLS == NULL)
  {
    cvProcessError(cv_mem, CV_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGCV_MEM_FAIL);
    cvSensFreeVectors(cv_mem);
    return (CV_MEM_FAIL);
  }

  /* attach the nonlinear solver to the CVODE memory */
  if (ism == CV_SIMULTANEOUS)
  {
    retval = CVodeSetNonlinearSolverSensSim(cv_mem, NLS);
  }
  else { retval = CVodeSetNonlinearSolverSensStg(cv_mem, NLS); }

  /* check that the nonlinear solver was successfully attached */
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, retval, __LINE__, __func__, __FILE__,
                   "Setting the nonlinear solver failed");
    cvSensFreeVectors(cv_mem);
    SUNNonlinSolFree(NLS);
    return (CV_MEM_FAIL);
  }

  /* set ownership flag */
  if (ism == CV_SIMULTANEOUS) { cv_mem->ownNLSsim = SUNTRUE; }
  else { cv_mem->ownNLSstg = SUNTRUE; }

  /* Sensitivity initialization was successfull */
  return (CV_SUCCESS);
}